

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.cc
# Opt level: O3

Type * __thiscall Typelib::Registry::build(Registry *this,string *name,size_t size)

{
  const_iterator cVar1;
  Type *pTVar2;
  string local_40;
  
  cVar1 = std::
          _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Typelib::Registry::RegistryType>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Typelib::Registry::RegistryType>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Typelib::Registry::RegistryType>_>_>
          ::find(&(this->m_current)._M_t,name);
  if (((_Rb_tree_header *)cVar1._M_node == &(this->m_current)._M_t._M_impl.super__Rb_tree_header) ||
     (pTVar2 = *(Type **)(cVar1._M_node + 2), pTVar2 == (Type *)0x0)) {
    getFullName(&local_40,this,name);
    pTVar2 = TypeBuilder::build(this,&local_40,(int)size);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
  }
  return pTVar2;
}

Assistant:

const Type* Registry::build(const std::string& name, std::size_t size)
    {
        const Type* type = get(name);
        if (type)
            return type;

        return TypeBuilder::build(*this, getFullName(name), size);
    }